

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRMath.cpp
# Opt level: O0

VRMatrix4 *
MinVR::VRMatrix4::projection(float left,float right,float bottom,float top,float near,float far)

{
  VRMatrix4 *in_RDI;
  float in_XMM0_Da;
  float in_XMM1_Da;
  float in_XMM2_Da;
  float in_XMM3_Da;
  float in_XMM4_Da;
  float in_XMM5_Da;
  float in_stack_00000010;
  float in_stack_00000018;
  float in_stack_00000020;
  float in_stack_00000028;
  float in_stack_00000030;
  float in_stack_00000038;
  float in_stack_00000040;
  
  fromRowMajorElements
            ((float)((ulong)in_RDI >> 0x20),SUB84(in_RDI,0),in_XMM0_Da,in_XMM1_Da,in_XMM2_Da,
             in_XMM3_Da,in_XMM4_Da,in_XMM5_Da,in_stack_00000010,in_stack_00000018,in_stack_00000020,
             in_stack_00000028,in_stack_00000030,in_stack_00000038,in_stack_00000040,far);
  return in_RDI;
}

Assistant:

VRMatrix4 VRMatrix4::projection(float left, float right,
                                float bottom, float top,
		                        float near, float far)
{
  return VRMatrix4::fromRowMajorElements(2.0f*near/(right-left), 0, (right+left)/(right-left), 0,
                                         0, 2.0f*near/(top-bottom), (top+bottom)/(top-bottom), 0,
                                         0, 0, -(far+near)/(far-near), -2.0f*far*near/(far-near),
                                         0, 0, -1, 0);
}